

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

UBool icu_63::isAcceptable(void *param_1,char *param_2,char *param_3,UDataInfo *pInfo)

{
  bool local_29;
  UDataInfo *pInfo_local;
  char *param_2_local;
  char *param_1_local;
  void *param_0_local;
  
  local_29 = false;
  if ((((0x13 < pInfo->size) && (local_29 = false, pInfo->isBigEndian == '\0')) &&
      (local_29 = false, pInfo->charsetFamily == '\0')) &&
     (((local_29 = false, pInfo->dataFormat[0] == 'u' &&
       (local_29 = false, pInfo->dataFormat[1] == 'n')) &&
      ((local_29 = false, pInfo->dataFormat[2] == 'a' &&
       (local_29 = false, pInfo->dataFormat[3] == 'm')))))) {
    local_29 = pInfo->formatVersion[0] == '\x01';
  }
  return local_29;
}

Assistant:

static UBool U_CALLCONV
isAcceptable(void * /*context*/,
             const char * /*type*/, const char * /*name*/,
             const UDataInfo *pInfo) {
    return (UBool)(
        pInfo->size>=20 &&
        pInfo->isBigEndian==U_IS_BIG_ENDIAN &&
        pInfo->charsetFamily==U_CHARSET_FAMILY &&
        pInfo->dataFormat[0]==0x75 &&   /* dataFormat="unam" */
        pInfo->dataFormat[1]==0x6e &&
        pInfo->dataFormat[2]==0x61 &&
        pInfo->dataFormat[3]==0x6d &&
        pInfo->formatVersion[0]==1);
}